

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O3

void gen_l3_ctrl(CPUPPCState_conflict2 *env)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  if (((((env->spr_cb[0x3fa].name == (char *)0x0) && (env->spr[0x3fa] == 0)) &&
       (env->spr_cb[0x3fa].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      ((env->spr_cb[0x3fa].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0x3fa].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
     (env->spr_cb[0x3fa].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
    env->spr_cb[0x3fa].name = "L3CR";
    env->spr_cb[0x3fa].uea_read = spr_noaccess;
    env->spr_cb[0x3fa].uea_write = spr_noaccess;
    env->spr_cb[0x3fa].oea_read = spr_read_generic;
    env->spr_cb[0x3fa].oea_write = spr_write_generic;
    env->spr_cb[0x3fa].hea_read = spr_read_generic;
    env->spr_cb[0x3fa].hea_write = spr_write_generic;
    env->spr_cb[0x3fa].default_value = 0;
    env->spr[0x3fa] = 0;
    if (((env->spr_cb[0x3d8].name == (char *)0x0) && (env->spr[0x3d8] == 0)) &&
       ((env->spr_cb[0x3d8].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x3d8].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x3d8].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x3d8].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x3d8].name = "L3ITCR0";
      env->spr_cb[0x3d8].uea_read = spr_noaccess;
      env->spr_cb[0x3d8].uea_write = spr_noaccess;
      env->spr_cb[0x3d8].oea_read = spr_read_generic;
      env->spr_cb[0x3d8].oea_write = spr_write_generic;
      env->spr_cb[0x3d8].hea_read = spr_read_generic;
      env->spr_cb[0x3d8].hea_write = spr_write_generic;
      env->spr_cb[0x3d8].default_value = 0;
      env->spr[0x3d8] = 0;
      if ((((env->spr_cb[0x3d7].name == (char *)0x0) && (env->spr[0x3d7] == 0)) &&
          ((env->spr_cb[0x3d7].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
           ((env->spr_cb[0x3d7].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
            (env->spr_cb[0x3d7].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))))) &&
         (env->spr_cb[0x3d7].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
        env->spr_cb[0x3d7].name = "L3PM";
        env->spr_cb[0x3d7].uea_read = spr_noaccess;
        env->spr_cb[0x3d7].uea_write = spr_noaccess;
        env->spr_cb[0x3d7].oea_read = spr_read_generic;
        env->spr_cb[0x3d7].oea_write = spr_write_generic;
        env->spr_cb[0x3d7].hea_read = spr_read_generic;
        env->spr_cb[0x3d7].hea_write = spr_write_generic;
        env->spr_cb[0x3d7].default_value = 0;
        env->spr[0x3d7] = 0;
        return;
      }
      uVar2 = 0x3d7;
      uVar1 = 0x3d7;
    }
    else {
      uVar2 = 0x3d8;
      uVar1 = 0x3d8;
    }
  }
  else {
    uVar2 = 0x3fa;
    uVar1 = 0x3fa;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static void gen_l3_ctrl(CPUPPCState *env)
{
    /* L3CR */
    /* XXX : not implemented */
    spr_register(env, SPR_L3CR, "L3CR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* L3ITCR0 */
    /* XXX : not implemented */
    spr_register(env, SPR_L3ITCR0, "L3ITCR0",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* L3PM */
    /* XXX : not implemented */
    spr_register(env, SPR_L3PM, "L3PM",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
}